

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diy_fp.h
# Opt level: O0

diy_fp<float,_floaxie::diy_fp_traits<float>_> * __thiscall
floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>::operator*=
          (diy_fp<float,_floaxie::diy_fp_traits<float>_> *this,
          diy_fp<float,_floaxie::diy_fp_traits<float>_> *rhs)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  uint uVar9;
  mantissa_storage_type tmp;
  mantissa_storage_type bd;
  mantissa_storage_type ad;
  mantissa_storage_type bc;
  mantissa_storage_type ac;
  mantissa_storage_type d;
  mantissa_storage_type c;
  mantissa_storage_type b;
  mantissa_storage_type a;
  uint mask_half;
  size_t half_width;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *rhs_local;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *this_local;
  
  uVar9 = this->m_f >> 0x10;
  uVar2 = this->m_f & 0xffff;
  uVar3 = rhs->m_f >> 0x10;
  uVar4 = rhs->m_f & 0xffff;
  uVar5 = uVar2 * uVar3;
  uVar6 = uVar9 * uVar4;
  uVar7 = raised_bit<unsigned_int>(0xf);
  this->m_f = uVar9 * uVar3 + (uVar6 >> 0x10) + (uVar5 >> 0x10) +
              ((uVar2 * uVar4 >> 0x10) + (uVar6 & 0xffff) + (uVar5 & 0xffff) + uVar7 >> 0x10);
  iVar1 = rhs->m_e;
  sVar8 = bit_size<unsigned_int>();
  this->m_e = this->m_e + iVar1 + (int)sVar8;
  return this;
}

Assistant:

diy_fp& operator*=(const diy_fp& rhs) noexcept
		{
			constexpr std::size_t half_width = bit_size<mantissa_storage_type>() / 2;
			constexpr auto mask_half = mask<mantissa_storage_type>(half_width);

			const mantissa_storage_type a = m_f >> half_width;
			const mantissa_storage_type b = m_f & mask_half;
			const mantissa_storage_type c = rhs.m_f >> half_width;
			const mantissa_storage_type d = rhs.m_f & mask_half;

			const mantissa_storage_type ac = a * c;
			const mantissa_storage_type bc = b * c;
			const mantissa_storage_type ad = a * d;
			const mantissa_storage_type bd = b * d;

			const mantissa_storage_type tmp = (bd >> half_width) + (ad & mask_half) + (bc & mask_half) + raised_bit<mantissa_storage_type>(half_width - 1);

			m_f = ac + (ad >> half_width) + (bc >> half_width) + (tmp >> half_width);
			m_e += rhs.m_e + bit_size<mantissa_storage_type>();

			return *this;
		}